

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_room_of_chambers(chunk_conflict *c,loc centre,wchar_t rating)

{
  int iVar1;
  bool bVar2;
  _Bool _Var3;
  int16_t iVar4;
  int16_t iVar5;
  uint32_t uVar6;
  wchar_t h;
  uint32_t uVar7;
  wchar_t w;
  wchar_t y1_00;
  wchar_t x1_00;
  wchar_t y2_00;
  wchar_t x2_00;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  loc_conflict lVar11;
  square_conflict *psVar12;
  loc_conflict grid_00;
  loc_conflict grid_01;
  size_t sVar13;
  char *local_1a8;
  wchar_t local_1a0;
  wchar_t local_198;
  wchar_t local_194;
  wchar_t local_18c;
  wchar_t local_188;
  wchar_t local_180;
  wchar_t local_17c;
  wchar_t local_174;
  int local_170;
  int local_168;
  int local_15c;
  int local_154;
  int local_13c;
  int local_134;
  loc grid1_4;
  loc grid1_3;
  loc grid1_2;
  loc grid3;
  loc grid2;
  loc grid1_1;
  _Bool joy;
  loc grid1;
  wchar_t height_local;
  wchar_t width_local;
  wchar_t size;
  wchar_t c_x2;
  wchar_t c_y2;
  wchar_t c_x1;
  wchar_t c_y1;
  char local_88 [7];
  _Bool light;
  char name [40];
  int local_58;
  wchar_t count;
  wchar_t width;
  wchar_t height;
  loc grid;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t num_chambers;
  wchar_t area;
  wchar_t d;
  wchar_t i;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  unique0x1000095f = centre;
  uVar6 = Rand_div(0x2d);
  iVar1 = c->depth;
  iVar4 = m_bonus(0x14,c->depth);
  h = iVar4 + L'\x14';
  uVar7 = Rand_div(0x14);
  iVar5 = m_bonus(0x14,c->depth);
  w = uVar7 + 0x15 + (int)iVar5;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
  if (((iStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var3 = find_space((loc *)((long)&c_local + 4),h,w), _Var3)) {
    y1_00 = iStack_10 - h / 2;
    x1_00 = c_local._4_4_ - w / 2;
    y2_00 = iStack_10 + (iVar4 + 0x13) / 2;
    x2_00 = c_local._4_4_ + (w + L'\xffffffff') / 2;
    lVar11 = (loc_conflict)loc(x1_00,y1_00);
    _Var3 = square_in_bounds((chunk *)c,lVar11);
    if (_Var3) {
      lVar11 = (loc_conflict)loc(x2_00,y2_00);
      _Var3 = square_in_bounds((chunk *)c,lVar11);
      if (_Var3) {
        if (y2_00 - y1_00 < 0) {
          local_134 = -(y2_00 - y1_00);
        }
        else {
          local_134 = y2_00 - y1_00;
        }
        if (x2_00 - x1_00 < 0) {
          local_13c = -(x2_00 - x1_00);
        }
        else {
          local_13c = x2_00 - x1_00;
        }
        for (area = L'\0'; area < (local_134 * local_13c) / 0x50 + L'\n'; area = area + L'\x01') {
          uVar7 = Rand_div(4);
          uVar8 = Rand_div(10);
          iVar9 = uVar7 + 3 + uVar8;
          uVar8 = Rand_div(4);
          iVar10 = uVar7 + 3 + uVar8;
          uVar7 = Rand_div(((y2_00 + L'\x01') - y1_00) - iVar10);
          uVar8 = Rand_div(((x2_00 + L'\x01') - x1_00) - iVar9);
          size = y1_00 + uVar7 + iVar10;
          if (y2_00 < size) {
            size = y2_00;
          }
          width_local = x1_00 + uVar8 + iVar9;
          if (x2_00 < width_local) {
            width_local = x2_00;
          }
          make_chamber(c,y1_00 + uVar7,x1_00 + uVar8,size,width_local);
        }
        height = y1_00;
        while (height <= y2_00) {
          width = x1_00;
          while( true ) {
            if (x2_00 < width) break;
            local_58 = 0;
            _Var3 = square_in_bounds_fully((chunk *)c,_width);
            if (_Var3) {
              for (num_chambers = L'\0'; num_chambers < L'\b'; num_chambers = num_chambers + L'\x01'
                  ) {
                lVar11 = (loc_conflict)loc_sum((loc)_width,ddgrid_ddd[num_chambers]);
                psVar12 = square((chunk *)c,lVar11);
                if ((((uint)psVar12->feat == FEAT_GRANITE) &&
                    (_Var3 = square_iswall_outer((chunk *)c,lVar11), !_Var3)) &&
                   (_Var3 = square_iswall_solid((chunk *)c,lVar11), !_Var3)) {
                  local_58 = local_58 + 1;
                }
              }
              if ((local_58 == 5) &&
                 (psVar12 = square((chunk *)c,_width), (uint)psVar12->feat != FEAT_MAGMA)) {
                set_marked_granite(c,(loc)_width,L'\v');
              }
              else if (5 < local_58) {
                set_marked_granite(c,(loc)_width,L'\v');
              }
            }
            width = width + L'\x01';
          }
          height = height + L'\x01';
        }
        for (area = L'\0'; area < L'2'; area = area + L'\x01') {
          if (x2_00 - x1_00 < 0) {
            local_154 = -(x2_00 - x1_00);
          }
          else {
            local_154 = x2_00 - x1_00;
          }
          if (x2_00 - x1_00 < 0) {
            local_15c = -(x2_00 - x1_00);
          }
          else {
            local_15c = x2_00 - x1_00;
          }
          uVar7 = Rand_div(local_15c / 2);
          if (y2_00 - y1_00 < 0) {
            local_168 = -(y2_00 - y1_00);
          }
          else {
            local_168 = y2_00 - y1_00;
          }
          if (y2_00 - y1_00 < 0) {
            local_170 = -(y2_00 - y1_00);
          }
          else {
            local_170 = y2_00 - y1_00;
          }
          uVar8 = Rand_div(local_170 / 2);
          _width = (loc_conflict)loc(x1_00 + local_154 / 4 + uVar7,y1_00 + local_168 / 4 + uVar8);
          psVar12 = square((chunk *)c,_width);
          if ((uint)psVar12->feat == FEAT_MAGMA) break;
        }
        square_set_feat((chunk *)c,_width,FEAT_FLOOR);
        hollow_out_room(c,(loc)_width);
        for (area = L'\0'; height = y1_00, area < L'd'; area = area + L'\x01') {
          bVar2 = false;
          for (; height < y2_00; height = height + L'\x01') {
            width = x1_00;
            while( true ) {
              if (x2_00 <= width) break;
              psVar12 = square((chunk *)c,_width);
              if (((uint)psVar12->feat == FEAT_MAGMA) &&
                 (_Var3 = square_in_bounds_fully((chunk *)c,_width), _Var3)) {
                for (num_chambers = L'\0'; num_chambers < L'\x04';
                    num_chambers = num_chambers + L'\x01') {
                  lVar11 = (loc_conflict)loc_sum((loc)_width,ddgrid_ddd[num_chambers]);
                  _Var3 = square_iswall_inner((chunk *)c,lVar11);
                  if (_Var3) {
                    grid_00 = (loc_conflict)loc_sum((loc)lVar11,ddgrid_ddd[num_chambers]);
                    _Var3 = square_in_bounds((chunk *)c,grid_00);
                    if (_Var3) {
                      psVar12 = square((chunk *)c,grid_00);
                      if ((uint)psVar12->feat == FEAT_FLOOR) {
                        bVar2 = true;
                        square_set_feat((chunk *)c,lVar11,FEAT_BROKEN);
                        square_set_feat((chunk *)c,_width,FEAT_FLOOR);
                        hollow_out_room(c,(loc)_width);
                        break;
                      }
                      _Var3 = square_iswall_inner((chunk *)c,grid_00);
                      if (_Var3) {
                        grid_01 = (loc_conflict)loc_sum((loc)grid_00,ddgrid_ddd[num_chambers]);
                        _Var3 = square_in_bounds((chunk *)c,grid_01);
                        if ((_Var3) &&
                           (psVar12 = square((chunk *)c,grid_01), (uint)psVar12->feat == FEAT_FLOOR)
                           ) {
                          bVar2 = true;
                          square_set_feat((chunk *)c,lVar11,FEAT_FLOOR);
                          square_set_feat((chunk *)c,grid_00,FEAT_FLOOR);
                          square_set_feat((chunk *)c,_width,FEAT_FLOOR);
                          hollow_out_room(c,(loc)_width);
                          break;
                        }
                      }
                    }
                  }
                }
              }
              width = width + L'\x01';
            }
          }
          height = y1_00;
          if (!bVar2) break;
        }
        for (; height <= y2_00; height = height + L'\x01') {
          width = x1_00;
          while( true ) {
            if (x2_00 < width) break;
            psVar12 = square((chunk *)c,_width);
            if ((uint)psVar12->feat == FEAT_OPEN) {
              set_marked_granite(c,(loc)_width,L'\v');
            }
            else {
              psVar12 = square((chunk *)c,_width);
              if ((uint)psVar12->feat == FEAT_BROKEN) {
                place_random_door(c,(loc)_width);
              }
            }
            width = width + L'\x01';
          }
        }
        if (y1_00 + L'\xffffffff' < 1) {
          local_174 = L'\0';
        }
        else {
          local_174 = y1_00 + L'\xffffffff';
        }
        height = local_174;
        do {
          if (y2_00 + L'\x02' < c->height) {
            local_17c = y2_00 + L'\x02';
          }
          else {
            local_17c = c->height;
          }
          if (local_17c <= height) {
            if (y1_00 + L'\xffffffff' < 1) {
              local_18c = L'\0';
            }
            else {
              local_18c = y1_00 + L'\xffffffff';
            }
            height = local_18c;
            do {
              if (y2_00 + L'\x02' < c->height) {
                local_194 = y2_00 + L'\x02';
              }
              else {
                local_194 = c->height;
              }
              if (local_194 <= height) {
                get_chamber_monsters((chunk *)c,y1_00,x1_00,y2_00,x2_00,local_88,h * w);
                add_to_monster_rating((chunk *)c,10);
                if (((player->opts).opt[0x18] & 1U) != 0) {
                  sVar13 = strlen(local_88);
                  if (sVar13 == 0) {
                    local_1a8 = "empty";
                  }
                  else {
                    local_1a8 = local_88;
                  }
                  msg("Room of chambers (%s)",local_1a8);
                }
                return true;
              }
              if (x1_00 + L'\xffffffff' < 1) {
                local_198 = L'\0';
              }
              else {
                local_198 = x1_00 + L'\xffffffff';
              }
              width = local_198;
              while( true ) {
                if (x2_00 + L'\x02' < c->width) {
                  local_1a0 = x2_00 + L'\x02';
                }
                else {
                  local_1a0 = c->width;
                }
                if (local_1a0 <= width) break;
                _Var3 = square_in_bounds_fully((chunk *)c,_width);
                if ((_Var3) && (_Var3 = square_iswall_inner((chunk *)c,_width), _Var3)) {
                  for (num_chambers = L'\0'; num_chambers < L'\t';
                      num_chambers = num_chambers + L'\x01') {
                    lVar11 = (loc_conflict)loc_sum((loc)_width,ddgrid_ddd[num_chambers]);
                    psVar12 = square((chunk *)c,lVar11);
                    if (((((uint)psVar12->feat == FEAT_GRANITE) &&
                         (_Var3 = square_iswall_inner((chunk *)c,_width), !_Var3)) &&
                        (_Var3 = square_iswall_outer((chunk *)c,_width), !_Var3)) &&
                       (_Var3 = square_iswall_solid((chunk *)c,_width), !_Var3)) {
                      set_marked_granite(c,(loc)_width,L'\f');
                      break;
                    }
                  }
                }
                width = width + L'\x01';
              }
              height = height + L'\x01';
            } while( true );
          }
          if (x1_00 + L'\xffffffff' < 1) {
            local_180 = L'\0';
          }
          else {
            local_180 = x1_00 + L'\xffffffff';
          }
          width = local_180;
          while( true ) {
            if (x2_00 + L'\x02' < c->width) {
              local_188 = x2_00 + L'\x02';
            }
            else {
              local_188 = c->width;
            }
            if (local_188 <= width) break;
            _Var3 = square_iswall_inner((chunk *)c,_width);
            if ((_Var3) || (psVar12 = square((chunk *)c,_width), (uint)psVar12->feat == FEAT_MAGMA))
            {
              for (num_chambers = L'\0'; num_chambers < L'\t'; num_chambers = num_chambers + L'\x01'
                  ) {
                lVar11 = (loc_conflict)loc_sum((loc)_width,ddgrid_ddd[num_chambers]);
                _Var3 = square_in_bounds((chunk *)c,lVar11);
                if (_Var3) {
                  psVar12 = square((chunk *)c,lVar11);
                  if ((uint)psVar12->feat == FEAT_FLOOR) break;
                  if (num_chambers == L'\b') {
                    set_marked_granite(c,(loc)_width,L'\0');
                  }
                }
              }
            }
            _Var3 = square_isfloor((chunk *)c,_width);
            if (_Var3) {
              for (num_chambers = L'\0'; num_chambers < L'\t'; num_chambers = num_chambers + L'\x01'
                  ) {
                lVar11 = (loc_conflict)loc_sum((loc)_width,ddgrid_ddd[num_chambers]);
                _Var3 = square_in_bounds((chunk *)c,lVar11);
                if (_Var3) {
                  psVar12 = square((chunk *)c,lVar11);
                  flag_on_dbg(psVar12->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                  psVar12 = square((chunk *)c,lVar11);
                  flag_on_dbg(psVar12->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                  if (iVar1 < (int)uVar6) {
                    psVar12 = square((chunk *)c,lVar11);
                    flag_on_dbg(psVar12->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                  }
                }
              }
            }
            width = width + L'\x01';
          }
          height = height + L'\x01';
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool build_room_of_chambers(struct chunk *c, struct loc centre, int rating)
{
	int i, d;
	int area, num_chambers;
	int y1, x1, y2, x2;
	struct loc grid;
	int height, width, count;

	char name[40];

	/* Deeper in the dungeon, chambers are less likely to be lit. */
	bool light = (randint0(45) > c->depth) ? true : false;

	/* Calculate a level-dependent room size. */
	height = 20 + m_bonus(20, c->depth);
	width = 20 + randint1(20) + m_bonus(20, c->depth);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Calculate the borders of the room. */
	y1 = centre.y - (height / 2);
	x1 = centre.x - (width / 2);
	y2 = centre.y + (height - 1) / 2;
	x2 = centre.x + (width - 1) / 2;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) || 
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Determine how much space we have. */
	area = ABS(y2 - y1) * ABS(x2 - x1);

	/* Calculate the number of smaller chambers to make. */
	num_chambers = 10 + area / 80;

	/* Build the chambers. */
	for (i = 0; i < num_chambers; i++) {
		int c_y1, c_x1, c_y2, c_x2;
		int size, width_local, height_local;

		/* Determine size of chamber. */
		size = 3 + randint0(4);
		width_local = size + randint0(10);
		height_local = size + randint0(4);

		/* Pick an upper-left corner at random. */
		c_y1 = y1 + randint0(1 + y2 - y1 - height_local);
		c_x1 = x1 + randint0(1 + x2 - x1 - width_local);

		/* Determine lower-right corner of chamber. */
		c_y2 = c_y1 + height_local;
		if (c_y2 > y2) c_y2 = y2;

		c_x2 = c_x1 + width_local;
		if (c_x2 > x2) c_x2 = x2;

		/* Make me a (magma filled) chamber. */
		make_chamber(c, c_y1, c_x1, c_y2, c_x2);
	}

	/* Remove useless doors, fill in tiny, narrow rooms. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			count = 0;

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid))
				continue;

			/* Check all adjacent grids. */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

				/* Count the walls and dungeon granite. */
				if ((square(c, grid1)->feat == FEAT_GRANITE) &&
					(!square_iswall_outer(c, grid1)) &&
					(!square_iswall_solid(c, grid1)))
					count++;
			}

			/* Five adjacent walls: Change non-chamber to wall. */
			if ((count == 5) && (square(c, grid)->feat != FEAT_MAGMA))
				set_marked_granite(c, grid, SQUARE_WALL_INNER);

			/* More than five adjacent walls: Change anything to wall. */
			else if (count > 5)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
		}
	}

	/* Pick a random magma spot near the center of the room. */
	for (i = 0; i < 50; i++) {
		grid = loc(x1 + ABS(x2 - x1) / 4 + randint0(ABS(x2 - x1) / 2),
				   y1 + ABS(y2 - y1) / 4 + randint0(ABS(y2 - y1) / 2));
		if (square(c, grid)->feat == FEAT_MAGMA)
			break;
	}

	/* Hollow out the first room. */
	square_set_feat(c, grid, FEAT_FLOOR);
	hollow_out_room(c, grid);

	/* Attempt to change every in-room magma grid to open floor. */
	for (i = 0; i < 100; i++) {
		/* Assume this run will do no useful work. */
		bool joy = false;

		/* Make new doors and tunnels between magma and open floor. */
		for (grid.y = y1; grid.y < y2; grid.y++) {
			for (grid.x = x1; grid.x < x2; grid.x++) {
				/* Current grid must be magma. */
				if (square(c, grid)->feat != FEAT_MAGMA) continue;

				/* Stay legal. */
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Check only horizontal and vertical directions. */
				for (d = 0; d < 4; d++) {
					struct loc grid1, grid2;

					/* Extract adjacent location */
					grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Need inner wall. */
					if (!square_iswall_inner(c, grid1)) 
						continue;

					/* Keep going in the same direction, if in bounds. */
					grid2 = loc_sum(grid1, ddgrid_ddd[d]);
					if (!square_in_bounds(c, grid2)) continue;

					/* If we find open floor, place a door. */
					if (square(c, grid2)->feat == FEAT_FLOOR) {
						joy = true;

						/* Make a broken door in the wall grid. */
						square_set_feat(c, grid1, FEAT_BROKEN);

						/* Hollow out the new room. */
						square_set_feat(c, grid, FEAT_FLOOR);
						hollow_out_room(c, grid);

						break;
					}

					/* If we find more inner wall... */
					if (square_iswall_inner(c, grid2)) {
						/* ...Keep going in the same direction. */
						struct loc grid3 = loc_sum(grid2, ddgrid_ddd[d]);
						if (!square_in_bounds(c, grid3)) continue;

						/* If we /now/ find floor, make a tunnel. */
						if (square(c, grid3)->feat == FEAT_FLOOR) {
							joy = true;

							/* Turn both wall grids into floor. */
							square_set_feat(c, grid1, FEAT_FLOOR);
							square_set_feat(c, grid2, FEAT_FLOOR);

							/* Hollow out the new room. */
							square_set_feat(c, grid, FEAT_FLOOR);
							hollow_out_room(c, grid);

							break;
						}
					}
				}
			}
		}

		/* If we could find no work to do, stop. */
		if (!joy) break;
	}


	/* Turn broken doors into a random kind of door, remove open doors. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (square(c, grid)->feat == FEAT_OPEN)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
			else if (square(c, grid)->feat == FEAT_BROKEN)
				place_random_door(c, grid);
		}
	}


	/* Turn all walls and magma not adjacent to floor into dungeon granite. */
	/* Turn all floors and adjacent grids into rooms, sometimes lighting them */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			if (square_iswall_inner(c, grid)
				|| (square(c, grid)->feat == FEAT_MAGMA)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* No floors allowed */
					if (square(c, grid1)->feat == FEAT_FLOOR) break;

					/* Turn me into dungeon granite. */
					if (d == 8)
						set_marked_granite(c, grid, SQUARE_NONE);
				}
			}
			if (square_isfloor(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* Turn into room, forbid stairs. */
					sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
					sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

					/* Illuminate if requested. */
					if (light) sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);
				}
			}
		}
	}


	/* Turn all inner wall grids adjacent to dungeon granite into outer walls */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid)) continue;

			if (square_iswall_inner(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Look for dungeon granite */
					if ((square(c, grid1)->feat == FEAT_GRANITE) && 
						(!square_iswall_inner(c, grid)) &&
						(!square_iswall_outer(c, grid)) &&
						(!square_iswall_solid(c, grid)))
					{
						/* Turn me into outer wall. */
						set_marked_granite(c, grid, SQUARE_WALL_OUTER);

						/* Done; */
						break;
					}
				}
			}
		}
	}

	/*** Now we get to place the monsters. ***/
	get_chamber_monsters(c, y1, x1, y2, x2, name, height * width);

	/* Increase the level rating */
	add_to_monster_rating(c, 10);

	/* Describe */
	ROOM_LOG("Room of chambers (%s)", strlen(name) ? name : "empty");

	/* Success. */
	return (true);
}